

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_cmp.cc
# Opt level: O1

int X509_check_private_key(X509 *x509,EVP_PKEY *pkey)

{
  int iVar1;
  EVP_PKEY *a;
  int iVar2;
  int line;
  
  iVar2 = 0;
  if (x509 == (X509 *)0x0) {
    a = (EVP_PKEY *)0x0;
  }
  else {
    a = (EVP_PKEY *)X509_PUBKEY_get0((X509_PUBKEY *)x509->cert_info->key);
  }
  if (a != (EVP_PKEY *)0x0) {
    iVar1 = EVP_PKEY_cmp(a,pkey);
    iVar2 = 1;
    if (iVar1 < 1) {
      if (iVar1 == -2) {
        iVar1 = 0x80;
        line = 0xdb;
      }
      else if (iVar1 == -1) {
        iVar1 = 0x73;
        line = 0xd8;
      }
      else {
        if (iVar1 != 0) {
          return 0;
        }
        iVar1 = 0x74;
        line = 0xd5;
      }
      iVar2 = 0;
      ERR_put_error(0xb,0,iVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_cmp.cc"
                    ,line);
    }
  }
  return iVar2;
}

Assistant:

int X509_check_private_key(const X509 *x, const EVP_PKEY *k) {
  const EVP_PKEY *xk = X509_get0_pubkey(x);
  if (xk == NULL) {
    return 0;
  }

  int ret = EVP_PKEY_cmp(xk, k);
  if (ret > 0) {
    return 1;
  }

  switch (ret) {
    case 0:
      OPENSSL_PUT_ERROR(X509, X509_R_KEY_VALUES_MISMATCH);
      return 0;
    case -1:
      OPENSSL_PUT_ERROR(X509, X509_R_KEY_TYPE_MISMATCH);
      return 0;
    case -2:
      OPENSSL_PUT_ERROR(X509, X509_R_UNKNOWN_KEY_TYPE);
      return 0;
  }

  return 0;
}